

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O0

int Ssw_ManSweepDyn(Ssw_Man_t *p)

{
  FILE *pFile;
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Aig_Man_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  abctime aVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *p1;
  Ssw_Sat_t *pSVar10;
  abctime clk;
  int f;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Bar_Progress_t *pProgress;
  Ssw_Man_t *p_local;
  
  pObj = (Aig_Obj_t *)0x0;
  aVar4 = Abc_Clock();
  pAVar5 = Ssw_FramesWithClasses(p);
  p->pFrames = pAVar5;
  Aig_ManFanoutStart(p->pFrames);
  iVar1 = Aig_ManObjNumMax(p->pFrames);
  p->nSRMiterMaxId = iVar1;
  iVar1 = p->pPars->nFramesK;
  pAVar6 = Aig_ManConst1(p->pAig);
  pAVar7 = Aig_ManConst1(p->pFrames);
  Ssw_ObjSetFrame(p,pAVar6,iVar1,pAVar7);
  for (clk._4_4_ = 0; iVar2 = Saig_ManPiNum(p->pAig), clk._4_4_ < iVar2; clk._4_4_ = clk._4_4_ + 1)
  {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,clk._4_4_);
    pAVar7 = Aig_ObjCreateCi(p->pFrames);
    Ssw_ObjSetFrame(p,pAVar6,iVar1,pAVar7);
  }
  Aig_ManSetCioIds(p->pFrames);
  Ssw_ManLabelPiNodes(p);
  aVar8 = Abc_Clock();
  p->timeReduce = (aVar8 - aVar4) + p->timeReduce;
  if (p->vSimInfo != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vSimInfo == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                  ,0x18e,"int Ssw_ManSweepDyn(Ssw_Man_t *)");
  }
  iVar2 = Aig_ManCiNum(p->pFrames);
  pVVar9 = Vec_PtrAllocSimInfo(iVar2,1);
  p->vSimInfo = pVVar9;
  Vec_PtrCleanSimInfo(p->vSimInfo,0,1);
  p->fRefined = 0;
  Ssw_ClassesClearRefined(p->ppClasses);
  pFile = _stdout;
  if (p->pPars->fVerbose != 0) {
    iVar2 = Aig_ManObjNumMax(p->pAig);
    pObj = (Aig_Obj_t *)Bar_ProgressStart(pFile,iVar2);
  }
  p->iNodeStart = 0;
  clk._4_4_ = 0;
  do {
    iVar2 = Vec_PtrSize(p->pAig->vObjs);
    if (iVar2 <= clk._4_4_) {
      if (0 < p->nPatterns) {
        p->iNodeLast = clk._4_4_;
        if (p->pPars->fLocalSim == 0) {
          Ssw_ManSweepResimulateDyn(p,iVar1);
        }
        else {
          Ssw_ManSweepResimulateDynLocal(p,iVar1);
        }
      }
      if (p->pPars->fVerbose != 0) {
        Bar_ProgressStop((Bar_Progress_t *)pObj);
      }
      return p->fRefined;
    }
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,clk._4_4_);
    if (pAVar6 != (Aig_Obj_t *)0x0) {
      if (p->iNodeStart == 0) {
        p->iNodeStart = clk._4_4_;
      }
      if (p->pPars->fVerbose != 0) {
        Bar_ProgressUpdate((Bar_Progress_t *)pObj,clk._4_4_,(char *)0x0);
      }
      iVar2 = Saig_ObjIsLo(p->pAig,pAVar6);
      if (iVar2 == 0) {
        iVar2 = Aig_ObjIsNode(pAVar6);
        if (iVar2 != 0) {
          pAVar5 = p->pFrames;
          pAVar7 = Ssw_ObjChild0Fra(p,pAVar6,iVar1);
          p1 = Ssw_ObjChild1Fra(p,pAVar6,iVar1);
          pAVar7 = Aig_And(pAVar5,pAVar7,p1);
          Ssw_ObjSetFrame(p,pAVar6,iVar1,pAVar7);
          uVar3 = Ssw_ManSweepNode(p,pAVar6,iVar1,0,(Vec_Int_t *)0x0);
          p->fRefined = uVar3 | p->fRefined;
        }
      }
      else {
        uVar3 = Ssw_ManSweepNode(p,pAVar6,iVar1,0,(Vec_Int_t *)0x0);
        p->fRefined = uVar3 | p->fRefined;
      }
      if ((p->pMSat->pSat == (sat_solver *)0x0) ||
         (((p->pPars->nSatVarMax2 != 0 && (p->pPars->nSatVarMax2 < p->pMSat->nSatVars)) &&
          (p->pPars->nRecycleCalls2 < p->nRecycleCalls)))) {
        if (0 < p->nPatterns) {
          p->iNodeLast = clk._4_4_;
          if (p->pPars->fLocalSim == 0) {
            Ssw_ManSweepResimulateDyn(p,iVar1);
          }
          else {
            Ssw_ManSweepResimulateDynLocal(p,iVar1);
          }
          p->iNodeStart = clk._4_4_ + 1;
        }
        Aig_ManCleanMarkAB(p->pFrames);
        Ssw_ManLabelPiNodes(p);
        if (p->pMSat != (Ssw_Sat_t *)0x0) {
          iVar2 = Abc_MaxInt(p->nVarsMax,p->pMSat->nSatVars);
          p->nVarsMax = iVar2;
          iVar2 = Abc_MaxInt(p->nCallsMax,p->pMSat->nSolverCalls);
          p->nCallsMax = iVar2;
          Ssw_SatStop(p->pMSat);
          p->nRecycles = p->nRecycles + 1;
          p->nRecyclesTotal = p->nRecyclesTotal + 1;
          p->nRecycleCalls = 0;
        }
        pSVar10 = Ssw_SatStart(0);
        p->pMSat = pSVar10;
        if (p->nPatterns != 0) {
          __assert_fail("p->nPatterns == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                        ,0x1c7,"int Ssw_ManSweepDyn(Ssw_Man_t *)");
        }
      }
      if (p->nPatterns == 0x20) {
        p->iNodeLast = clk._4_4_;
        if (p->pPars->fLocalSim == 0) {
          Ssw_ManSweepResimulateDyn(p,iVar1);
        }
        else {
          Ssw_ManSweepResimulateDynLocal(p,iVar1);
        }
        p->iNodeStart = clk._4_4_ + 1;
      }
    }
    clk._4_4_ = clk._4_4_ + 1;
  } while( true );
}

Assistant:

int Ssw_ManSweepDyn( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew;
    int i, f;
    abctime clk;

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    Aig_ManFanoutStart( p->pFrames );
    p->nSRMiterMaxId = Aig_ManObjNumMax( p->pFrames );

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
    Aig_ManSetCioIds( p->pFrames );
    // label nodes corresponding to primary inputs
    Ssw_ManLabelPiNodes( p );
p->timeReduce += Abc_Clock() - clk;

    // prepare simulation info
    assert( p->vSimInfo == NULL );
    p->vSimInfo = Vec_PtrAllocSimInfo( Aig_ManCiNum(p->pFrames), 1 );
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );

    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    p->iNodeStart = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->iNodeStart == 0 )
            p->iNodeStart = i;
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, NULL );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, NULL );
        }
        // check if it is time to recycle the solver
        if ( p->pMSat->pSat == NULL ||
            (p->pPars->nSatVarMax2 &&
             p->pMSat->nSatVars > p->pPars->nSatVarMax2 &&
             p->nRecycleCalls > p->pPars->nRecycleCalls2) )
        {
            // resimulate
            if ( p->nPatterns > 0 )
            {
                p->iNodeLast = i;
                if ( p->pPars->fLocalSim )
                    Ssw_ManSweepResimulateDynLocal( p, f );
                else
                    Ssw_ManSweepResimulateDyn( p, f );
                p->iNodeStart = i+1;
            }
//                Abc_Print( 1, "Recycling SAT solver with %d vars and %d calls.\n", 
//                    p->pMSat->nSatVars, p->nRecycleCalls );
//            Aig_ManCleanMarkAB( p->pAig );
            Aig_ManCleanMarkAB( p->pFrames );
            // label nodes corresponding to primary inputs
            Ssw_ManLabelPiNodes( p );
            // replace the solver
            if ( p->pMSat )
            {
                p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
                p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
                Ssw_SatStop( p->pMSat );
                p->nRecycles++;
                p->nRecyclesTotal++;
                p->nRecycleCalls = 0;
            }
            p->pMSat = Ssw_SatStart( 0 );
            assert( p->nPatterns == 0 );
        }
        // resimulate
        if ( p->nPatterns == 32 )
        {
            p->iNodeLast = i;
            if ( p->pPars->fLocalSim )
                Ssw_ManSweepResimulateDynLocal( p, f );
            else
                Ssw_ManSweepResimulateDyn( p, f );
            p->iNodeStart = i+1;
        }
    }
    // resimulate
    if ( p->nPatterns > 0 )
    {
        p->iNodeLast = i;
        if ( p->pPars->fLocalSim )
            Ssw_ManSweepResimulateDynLocal( p, f );
        else
            Ssw_ManSweepResimulateDyn( p, f );
    }
    // collect stats
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}